

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

SizedPtr google::protobuf::internal::AllocateAtLeast(size_t size)

{
  SizedPtr SVar1;
  long *in_FS_OFFSET;
  undefined1 auVar2 [16];
  size_t size_local;
  undefined8 local_10;
  
  if (*(long *)(*in_FS_OFFSET + -0x50) == 0) {
    size_local = (size_t)operator_new(size);
    local_10 = size;
  }
  else {
    auVar2 = (**(code **)(*in_FS_OFFSET + -0x50))(size,*(undefined8 *)(*in_FS_OFFSET + -0x48));
    local_10 = auVar2._8_8_;
    size_local = auVar2._0_8_;
  }
  SVar1.n = local_10;
  SVar1.p = (void *)size_local;
  return SVar1;
}

Assistant:

inline SizedPtr AllocateAtLeast(size_t size) {
#if !defined(NDEBUG) && defined(ABSL_HAVE_THREAD_LOCAL) && \
    defined(__cpp_inline_variables)
  if (allocate_at_least_hook != nullptr) {
    return allocate_at_least_hook(size, allocate_at_least_hook_context);
  }
#endif  // !NDEBUG && ABSL_HAVE_THREAD_LOCAL && __cpp_inline_variables
  return {::operator new(size), size};
}